

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_copy_imheader(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  int nrec;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int nkeys;
  char card [81];
  int local_8c;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  
  if (0 < *status) {
    return *status;
  }
  ffghsp(infptr,&local_8c,(int *)0x0,status);
  if (4 < local_8c) {
    nrec = 4;
    do {
      nrec = nrec + 1;
      ffgrec(infptr,nrec,&local_88,status);
      iVar1 = ffgkcl(&local_88);
      if (iVar1 != 100 && 0x14 < iVar1) {
        if (local_88 == 'D') {
          if (cStack_84 == ' ' &&
              CONCAT13(cStack_85,CONCAT12(cStack_86,CONCAT11(cStack_87,0x44))) == 0x45544144) {
            ffpdat(outfptr,status);
          }
          else {
LAB_00198c5e:
            ffprec(outfptr,&local_88,status);
          }
        }
        else {
          if ((local_88 != 'E') ||
             (CONCAT17(cStack_81,
                       CONCAT16(cStack_82,
                                CONCAT15(cStack_83,
                                         CONCAT14(cStack_84,
                                                  CONCAT13(cStack_85,
                                                           CONCAT12(cStack_86,
                                                                    CONCAT11(cStack_87,0x45)))))))
              != 0x20454d414e545845)) goto LAB_00198c5e;
          auVar2[0] = -(cStack_7c == 'O');
          auVar2[1] = -(cStack_7b == 'M');
          auVar2[2] = -(cStack_7a == 'P');
          auVar2[3] = -(cStack_79 == 'R');
          auVar2[4] = -(cStack_78 == 'E');
          auVar2[5] = -(cStack_77 == 'S');
          auVar2[6] = -(cStack_76 == 'S');
          auVar2[7] = -(cStack_75 == 'E');
          auVar2[8] = -(cStack_74 == 'D');
          auVar2[9] = -(cStack_73 == '_');
          auVar2[10] = -(cStack_72 == 'I');
          auVar2[0xb] = -(cStack_71 == 'M');
          auVar2[0xc] = -(cStack_70 == 'A');
          auVar2[0xd] = -(cStack_6f == 'G');
          auVar2[0xe] = -(cStack_6e == 'E');
          auVar2[0xf] = -(cStack_6d == '\'');
          auVar3[1] = -(cStack_87 == 'X');
          auVar3[0] = 0xff;
          auVar3[2] = -(cStack_86 == 'T');
          auVar3[3] = -(cStack_85 == 'N');
          auVar3[4] = -(cStack_84 == 'A');
          auVar3[5] = -(cStack_83 == 'M');
          auVar3[6] = -(cStack_82 == 'E');
          auVar3[7] = -(cStack_81 == ' ');
          auVar3[8] = -(cStack_80 == '=');
          auVar3[9] = -(cStack_7f == ' ');
          auVar3[10] = -(cStack_7e == '\'');
          auVar3[0xb] = -(cStack_7d == 'C');
          auVar3[0xc] = -(cStack_7c == 'O');
          auVar3[0xd] = -(cStack_7b == 'M');
          auVar3[0xe] = -(cStack_7a == 'P');
          auVar3[0xf] = -(cStack_79 == 'R');
          auVar3 = auVar3 & auVar2;
          if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) != 0xffff) {
            ffucrd(outfptr,"EXTNAME",&local_88,status);
          }
        }
        if (0 < *status) {
          return *status;
        }
      }
    } while (nrec < local_8c);
  }
  return *status;
}

Assistant:

int imcomp_copy_imheader(fitsfile *infptr, fitsfile *outfptr, int *status)
/*
    This routine reads the header keywords from the input image and
    copies them to the output image;  the manditory structural keywords
    and the checksum keywords are not copied. If the DATE keyword is copied,
    then it is updated with the current date and time.
*/
{
    int nkeys, ii, keyclass;
    char card[FLEN_CARD];	/* a header record */

    if (*status > 0)
        return(*status);

    ffghsp(infptr, &nkeys, NULL, status); /* get number of keywords in image */

    for (ii = 5; ii <= nkeys; ii++)  /* skip the first 4 keywords */
    {
        ffgrec(infptr, ii, card, status);

	keyclass = ffgkcl(card);  /* Get the type/class of keyword */

        /* don't copy structural keywords or checksum keywords */
        if ((keyclass <= TYP_CMPRS_KEY) || (keyclass == TYP_CKSUM_KEY))
	    continue;

        if (FSTRNCMP(card, "DATE ", 5) == 0) /* write current date */
        {
            ffpdat(outfptr, status);
        }
        else if (FSTRNCMP(card, "EXTNAME ", 8) == 0) 
        {
            /* don't copy default EXTNAME keyword from a compressed image */
            if (FSTRNCMP(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28))
            {
                /* if EXTNAME keyword already exists, overwrite it */
                /* otherwise append a new EXTNAME keyword */
                ffucrd(outfptr, "EXTNAME", card, status);
            }
        }
        else
        {
            /* just copy the keyword to the output header */
	    ffprec (outfptr, card, status);
        }

        if (*status > 0)
           return (*status);
    }
    return (*status);
}